

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
               (CodedInputStream *input,int32 *value)

{
  bool bVar1;
  uint32 local_24;
  uint32 *puStack_20;
  uint32 temp;
  int32 *value_local;
  CodedInputStream *input_local;
  
  puStack_20 = (uint32 *)value;
  value_local = (int32 *)input;
  bVar1 = io::CodedInputStream::ReadLittleEndian32(input,&local_24);
  if (bVar1) {
    *puStack_20 = local_24;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32, WireFormatLite::TYPE_SFIXED32>(
    io::CodedInputStream* input,
    int32* value) {
  uint32 temp;
  if (!input->ReadLittleEndian32(&temp)) return false;
  *value = static_cast<int32>(temp);
  return true;
}